

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O3

void P_StartLinkedSectorInterpolations
               (TArray<DInterpolation_*,_DInterpolation_*> *list,sector_t_conflict *sector,
               bool ceiling)

{
  extsector_t *peVar1;
  DInterpolation *pDVar2;
  long lVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  peVar1 = sector->e;
  uVar5 = (ulong)(uint)((int)CONCAT71(in_register_00000011,ceiling) << 4);
  if (*(int *)((long)&(peVar1->Linked).Floor.Sectors.Count + uVar5) != 0) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      lVar3 = *(long *)((long)&(peVar1->Linked).Floor.Sectors.Array + uVar5);
      uVar4 = *(uint *)(lVar3 + 8 + lVar7);
      if ((uVar4 & 1) != 0) {
        pDVar2 = sector_t::SetInterpolation(*(sector_t **)(lVar3 + lVar7),1,false);
        TArray<DInterpolation_*,_DInterpolation_*>::Grow(list,1);
        uVar4 = list->Count;
        list->Array[uVar4] = pDVar2;
        list->Count = uVar4 + 1;
        lVar3 = *(long *)((long)&(peVar1->Linked).Floor.Sectors.Array + uVar5);
        uVar4 = *(uint *)(lVar3 + 8 + lVar7);
      }
      if ((uVar4 & 2) != 0) {
        pDVar2 = sector_t::SetInterpolation(*(sector_t **)(lVar3 + lVar7),0,false);
        TArray<DInterpolation_*,_DInterpolation_*>::Grow(list,1);
        uVar4 = list->Count;
        list->Array[uVar4] = pDVar2;
        list->Count = uVar4 + 1;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar6 < *(uint *)((long)&(peVar1->Linked).Floor.Sectors.Count + uVar5));
  }
  return;
}

Assistant:

void P_StartLinkedSectorInterpolations(TArray<DInterpolation *> &list, sector_t *sector, bool ceiling)
{
	extsector_t::linked::plane &scrollplane = ceiling? sector->e->Linked.Ceiling : sector->e->Linked.Floor;

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Type & LINK_FLOOR)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::FloorMove, false));
		}
		if (scrollplane.Sectors[i].Type & LINK_CEILING)
		{
			list.Push(scrollplane.Sectors[i].Sector->SetInterpolation(sector_t::CeilingMove, false));
		}
	}
}